

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O3

void __thiscall r_comp::Decompiler::write_icmd(Decompiler *this,uint16_t read_index)

{
  Metadata *this_00;
  byte bVar1;
  short sVar2;
  short sVar3;
  ushort uVar4;
  uint16_t uVar5;
  uint16_t uVar6;
  uint16_t read_index_00;
  bool after_tail_wildcard;
  bool local_51;
  key_type local_50;
  
  if (this->closing_set == true) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_50._M_dataplus._M_p._0_1_ = 0x28;
  OutStream::push<char>(this->out_stream,(char *)&local_50,read_index);
  write_expression_head(this,read_index);
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(read_index + 1));
  sVar2 = r_code::Atom::asOpcode();
  this_00 = this->metadata;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"_inj","");
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_r_comp::Class>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          *)this_00,&local_50);
  sVar3 = r_code::Atom::asOpcode();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (sVar2 == sVar3) {
    r_code::vector<r_code::Atom>::operator[]
              ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)(read_index + 2));
    uVar4 = r_code::Atom::asIndex();
    r_code::vector<r_code::Atom>::operator[]
              ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)uVar4 + 2);
    uVar5 = r_code::Atom::asIndex();
  }
  else {
    uVar5 = 0;
  }
  r_code::vector<r_code::Atom>::operator[]
            ((vector<r_code::Atom> *)(this->current_object + 8),(ulong)read_index);
  bVar1 = r_code::Atom::getAtomCount();
  local_51 = false;
  if (bVar1 != 0) {
    uVar4 = (ushort)bVar1;
    read_index_00 = read_index + 1;
    do {
      if (local_51 == false) {
        uVar6 = uVar5;
        if (this->closing_set == true) {
          this->closing_set = false;
          write_indent(this,this->indents);
        }
        else {
          local_50._M_dataplus._M_p._0_1_ = 0x20;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)this->out_stream->stream,(char *)&local_50,1);
        }
      }
      else {
        uVar6 = 0;
      }
      write_any(this,read_index_00,&local_51,true,uVar6);
      read_index_00 = read_index_00 + 1;
      uVar4 = uVar4 - 1;
    } while (uVar4 != 0);
  }
  if (this->closing_set != false) {
    this->closing_set = false;
    write_indent(this,this->indents);
  }
  local_50._M_dataplus._M_p._0_1_ = 0x29;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this->out_stream->stream,(char *)&local_50,1);
  return;
}

Assistant:

void Decompiler::write_icmd(uint16_t read_index)
{
    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    out_stream->push('(', read_index);
    write_expression_head(read_index);
    //write_expression_tail(read_index,true);
    uint16_t write_as_view_index = 0;

    if (current_object->code[read_index + 1].asOpcode() == metadata->classes.find("_inj")->second.atom.asOpcode()) {
        uint16_t arg_set_index = current_object->code[read_index + 2].asIndex(); // 2 args for _inj; the view is the second.
        write_as_view_index = current_object->code[arg_set_index + 2].asIndex();
    }

    uint16_t arity = current_object->code[read_index].getAtomCount();
    bool after_tail_wildcard = false;

    for (uint16_t i = 0; i < arity; ++i) {
        if (after_tail_wildcard) {
            write_any(++read_index, after_tail_wildcard, true);
        } else {
            if (closing_set) {
                closing_set = false;
                write_indent(indents);
            } else {
                *out_stream << ' ';
            }

            write_any(++read_index, after_tail_wildcard, true, write_as_view_index);
        }
    }

    if (closing_set) {
        closing_set = false;
        write_indent(indents);
    }

    *out_stream << ')';
}